

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listimagewindow.cc
# Opt level: O3

void __thiscall bgui::ListImageWindow::set(ListImageWindow *this,int pos,int w,int h,bool size_max)

{
  pointer ppIVar1;
  ImageAdapterBase *adapter;
  double dVar2;
  keep k;
  
  if ((pos < 0) ||
     (ppIVar1 = (this->list).
                super__Vector_base<bgui::ImageAdapterBase_*,_std::allocator<bgui::ImageAdapterBase_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
     (int)((ulong)((long)(this->list).
                         super__Vector_base<bgui::ImageAdapterBase_*,_std::allocator<bgui::ImageAdapterBase_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1) >> 3) <= pos))
  goto LAB_001172e8;
  adapter = ppIVar1[(uint)pos];
  dVar2 = this->imax;
  k = this->kp;
  if (dVar2 <= this->imin || k != keep_all) {
    if (w < 1 || h < 1) {
      if (k == keep_none) {
        adapter->map = this->map;
        adapter->channel = this->channel;
      }
      goto LAB_001172cb;
    }
LAB_00117290:
    adapter->map = this->map;
    adapter->channel = this->channel;
    k = keep_none;
  }
  else {
    adapter->imin = this->imin;
    adapter->imax = dVar2;
    if (0 < h && 0 < w) goto LAB_00117290;
LAB_001172cb:
    size_max = false;
    w = -1;
    h = -1;
  }
  ImageWindow::setAdapter(&this->super_ImageWindow,adapter,false,k,w,h,size_max);
LAB_001172e8:
  updateTitle(this);
  return;
}

Assistant:

void ListImageWindow::set(int pos, int w, int h, bool size_max)
{
  if (pos >= 0 && pos < static_cast<int>(list.size()))
  {
    ImageAdapterBase *adapt=list[pos];

    if (imin < imax && kp == keep_all)
    {
      adapt->setMinIntensity(imin);
      adapt->setMaxIntensity(imax);
    }

    if (w > 0 && h > 0)
    {
      adapt->setMapping(map);
      adapt->setChannel(channel);
      setAdapter(adapt, false, keep_none, w, h, size_max);
    }
    else
    {
      if (kp == keep_none)
      {
        adapt->setMapping(map);
        adapt->setChannel(channel);
      }

      setAdapter(adapt, false, kp);
    }
  }

  updateTitle();
}